

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

string * __thiscall shine::string::format_append(string *this,int8 *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  size_type local_60;
  size_type size;
  va_list args;
  undefined1 local_38 [8];
  string tmp;
  int8 *fmt_local;
  string *this_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  tmp.super_string.field_2._8_8_ = fmt;
  string((string *)local_38);
  args[0].overflow_arg_area = local_128;
  args[0]._0_8_ = &stack0x00000008;
  size._4_4_ = 0x30;
  size._0_4_ = 0x10;
  local_60 = assert_size(tmp.super_string.field_2._8_8_,(__va_list_tag *)&size);
  args[0].overflow_arg_area = local_128;
  args[0]._0_8_ = &stack0x00000008;
  size._4_4_ = 0x30;
  size._0_4_ = 0x10;
  std::__cxx11::string::resize((ulong)local_38);
  format((string *)local_38,(int8 *)tmp.super_string.field_2._8_8_,(__va_list_tag *)&size);
  std::__cxx11::string::resize((ulong)local_38);
  std::__cxx11::string::append((string *)this);
  ~string((string *)local_38);
  return this;
}

Assistant:

string& format_append(const int8 *fmt, ...){
            string tmp;
            va_list args;
                    va_start(args, fmt);
            size_type size = assert_size(fmt, args);
                    va_end(args);

                    va_start(args, fmt);
            tmp.resize(size + 1);
            format(tmp, fmt, args);
                    va_end(args);
            tmp.resize(size);

            append(tmp);
            return *this;

        }